

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void estimate<std::_Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>>
               (Graph *g,string_view name,
               _Bind<std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
               *f,bool show)

{
  rep rVar1;
  bool bVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  size_type sVar5;
  reference bridges_00;
  vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> *e;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  *__range2;
  duration<double,_std::ratio<1L,_1L>_> local_90 [3];
  size_t local_78;
  char *pcStack_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  time_point end;
  undefined1 local_50 [8];
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  bridges;
  time_point start;
  bool show_local;
  _Bind<std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_(Graph::*(std::_Placeholder<1>,_unsigned_long))(bool)>
  *f_local;
  Graph *g_local;
  string_view name_local;
  
  bridges.
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::_V2::system_clock::now();
  end.__d.__r = (duration)(duration)g;
  std::
  _Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>
  ::operator()((vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
                *)local_50,
               (_Bind<std::vector<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>,std::allocator<std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>>>(Graph::*(std::_Placeholder<1>,unsigned_long))(bool)>
                *)f,(Graph **)&end);
  local_60.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_78 = name._M_len;
  pcStack_70 = name._M_str;
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,name);
  poVar4 = std::operator<<(pbVar3," search found ");
  sVar5 = std::
          vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
          ::size((vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
                  *)local_50);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  poVar4 = std::operator<<(poVar4," bridges and worked for ");
  __range2 = (vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
              *)std::chrono::operator-
                          (&local_60,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&bridges.
                               super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)local_90,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&__range2);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_90);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar1);
  poVar4 = std::operator<<(poVar4," sec.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (show) {
    __end0 = std::
             vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
             ::begin((vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
                      *)local_50);
    e = (vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> *)
        std::
        vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
        ::end((vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
               *)local_50);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_*,_std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_>
                                       *)&e), bVar2) {
      bridges_00 = __gnu_cxx::
                   __normal_iterator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_*,_std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_>
                   ::operator*(&__end0);
      poVar4 = operator<<((ostream *)&std::cout,bridges_00);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_*,_std::vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>_>
      ::operator++(&__end0);
    }
  }
  std::
  vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  ::~vector((vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
             *)local_50);
  return;
}

Assistant:

void estimate(Graph &g, std::string_view name, Functor f, bool show) {
    auto start = std::chrono::system_clock::now();
    auto bridges = f(&g);
    auto end = std::chrono::system_clock::now();

    std::cout << name << " search found " << bridges.size()
              << " bridges and worked for "
              << std::chrono::duration<double>(end - start).count() << " sec."
              << std::endl;

    if (show)
        for (auto &e : bridges)
            std::cout << e << std::endl;
}